

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O3

uint __thiscall ADE_DEP_DPFSP::valutaIndividuo(ADE_DEP_DPFSP *this,Permutazione *p)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  unsigned_short *puVar4;
  uint **ppuVar5;
  int *__s;
  int iVar6;
  uint uVar7;
  ushort uVar8;
  short sVar9;
  ulong uVar10;
  uint *puVar11;
  ulong uVar12;
  uint uVar13;
  
  uVar1 = (this->istanza).macchine;
  uVar12 = (ulong)uVar1;
  __s = (int *)operator_new__((ulong)uVar1 << 2);
  uVar13 = 0;
  memset(__s,0,(ulong)uVar1 << 2);
  uVar2 = (this->istanza).lavori;
  iVar6 = (uint)(this->istanza).fabbriche + (uint)uVar2 + -1;
  if (0 < iVar6) {
    puVar4 = p->individuo;
    ppuVar5 = (this->istanza).p;
    uVar8 = 0;
    sVar9 = 0;
    uVar13 = 0;
    do {
      uVar3 = puVar4[uVar8];
      if (uVar3 < uVar2) {
        if (uVar1 != 0) {
          uVar10 = 0;
          do {
            if (sVar9 == 0 && (short)uVar10 == 0) {
              __s[uVar10] = *ppuVar5[uVar3];
            }
            else {
              if (uVar10 == 0 || sVar9 == 0) {
                puVar11 = ppuVar5[uVar3];
                if (sVar9 != 0 || uVar10 == 0) {
                  *__s = *__s + *puVar11;
                  goto LAB_00105696;
                }
                uVar7 = __s[uVar10 - 1];
              }
              else {
                uVar7 = __s[uVar10];
                if ((uint)__s[uVar10] < (uint)__s[(int)uVar10 - 1]) {
                  uVar7 = __s[(int)uVar10 - 1];
                }
                puVar11 = ppuVar5[uVar3];
              }
              __s[uVar10] = uVar7 + puVar11[uVar10];
            }
LAB_00105696:
            uVar10 = uVar10 + 1;
          } while (uVar12 != uVar10);
        }
        sVar9 = sVar9 + 1;
      }
      else {
        if (uVar13 <= (uint)__s[uVar12 - 1]) {
          uVar13 = __s[uVar12 - 1];
        }
        sVar9 = 0;
      }
      uVar8 = uVar8 + 1;
    } while ((int)(uint)uVar8 < iVar6);
  }
  uVar7 = __s[uVar12 - 1];
  if ((uint)__s[uVar12 - 1] < uVar13) {
    uVar7 = uVar13;
  }
  operator_delete__(__s);
  return uVar7;
}

Assistant:

unsigned int ADE_DEP_DPFSP::valutaIndividuo(Permutazione* p) {

	auto Cm = make_unique<unsigned int[]>(istanza.macchine);

	unsigned int Cmax = 0;
	short c = 0;

	for (unsigned short k = 0; k < istanza.lavori + istanza.fabbriche - 1; k++, c++) {

		if (p->individuo[k] >= istanza.lavori) {
			Cmax = max(Cmax, Cm[istanza.macchine - 1]);
			c = -1;
		}
		else {
			for (unsigned short j = 0; j < istanza.macchine; j++) {

				if (c == 0 && j == 0) {
					Cm[j] = istanza.p[p->individuo[k]][0];
				}
				else if (c != 0 && j != 0) {
					Cm[j] = istanza.p[p->individuo[k]][j] + max(Cm[j - 1], Cm[j]);
				}
				else if (c == 0 && j != 0) {
					Cm[j] = istanza.p[p->individuo[k]][j] + Cm[j - 1];
				}
				else {
					Cm[0] = istanza.p[p->individuo[k]][0] + Cm[0];
				}
			}
		}
	}

	return max(Cmax, Cm[istanza.macchine - 1]);
}